

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O0

void sk_addrcopy(SockAddr *addr,char *buf)

{
  addrinfo *paVar1;
  sockaddr *psVar2;
  int local_38;
  int local_34;
  int local_30;
  int family;
  SockAddrStep step;
  char *buf_local;
  SockAddr *addr_local;
  
  paVar1 = addr->ais;
  if (addr->superfamily == UNRESOLVED) {
    local_30 = 0;
  }
  else {
    if (addr->superfamily == UNIX) {
      local_34 = 1;
    }
    else {
      if (paVar1 == (addrinfo *)0x0) {
        local_38 = 2;
      }
      else {
        local_38 = paVar1->ai_family;
      }
      local_34 = local_38;
    }
    local_30 = local_34;
  }
  if (local_30 == 2) {
    *(undefined4 *)buf = *(undefined4 *)(paVar1->ai_addr->sa_data + 2);
  }
  else {
    if (local_30 != 10) {
      __assert_fail("false && \"bad address family in sk_addrcopy\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/network.c"
                    ,0x1c0,"void sk_addrcopy(SockAddr *, char *)");
    }
    psVar2 = paVar1->ai_addr;
    *(undefined8 *)buf = *(undefined8 *)(psVar2->sa_data + 6);
    *(undefined8 *)(buf + 8) = *(undefined8 *)(psVar2 + 1);
  }
  return;
}

Assistant:

void sk_addrcopy(SockAddr *addr, char *buf)
{
    SockAddrStep step;
    int family;
    START_STEP(addr, step);
    family = SOCKADDR_FAMILY(addr, step);

#ifndef NO_IPV6
    if (family == AF_INET)
        memcpy(buf, &((struct sockaddr_in *)step.ai->ai_addr)->sin_addr,
               sizeof(struct in_addr));
    else if (family == AF_INET6)
        memcpy(buf, &((struct sockaddr_in6 *)step.ai->ai_addr)->sin6_addr,
               sizeof(struct in6_addr));
    else
        unreachable("bad address family in sk_addrcopy");
#else
    struct in_addr a;

    assert(family == AF_INET);
    a.s_addr = htonl(addr->addresses[step.curraddr]);
    memcpy(buf, (char*) &a.s_addr, 4);
#endif
}